

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O2

ostream * ApprovalTests::operator<<(ostream *os,Storyboard *board)

{
  string local_30 [32];
  
  ::std::__cxx11::stringbuf::str();
  ::std::operator<<(os,local_30);
  ::std::__cxx11::string::~string(local_30);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Storyboard& board)
    {
        os << board.output_.str();
        return os;
    }